

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

optional<std::shared_ptr<AssignStatementAstNode>_> * __thiscall
Parser::parseAssignStatement
          (optional<std::shared_ptr<AssignStatementAstNode>_> *__return_storage_ptr__,Parser *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  TokenType type;
  undefined1 local_98 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_80;
  element_type *local_78;
  shared_ptr<Token> identifier;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60 [3];
  undefined1 local_48 [8];
  optional<std::shared_ptr<ExpressionAstNode>_> expression;
  bool error;
  
  expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload.
  super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
  super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._23_1_ = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&identifier.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ,"Expected a identifier",(allocator<char> *)local_48);
  this_00 = &identifier.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  type = (TokenType)this;
  expect((Parser *)&stack0xffffffffffffff88,type,(bool *)0x18,
         (string *)
         &expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
          _M_payload.super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>
          .super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>.field_0x17);
  std::__cxx11::string::~string((string *)this_00);
  skipWhiteSpace(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&identifier.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ,"Expected an equals following var declaration",(allocator<char> *)local_48);
  expect((Parser *)local_98,type,(bool *)0x12,
         (string *)
         &expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
          _M_payload.super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>
          .super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>.field_0x17);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_98 + 8));
  std::__cxx11::string::~string((string *)this_00);
  parseExpression((optional<std::shared_ptr<ExpressionAstNode>_> *)local_48,this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&identifier.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ,"Expected a semicolon following expression of var declaration",
             (allocator<char> *)
             &expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
              _M_payload.
              super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
              super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>.field_0x16);
  expect((Parser *)(local_98 + 0x10),type,(bool *)0x10,
         (string *)
         &expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
          _M_payload.super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>
          .super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>.field_0x17);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80);
  std::__cxx11::string::~string
            ((string *)&identifier.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  if (((expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload
        .super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
        super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._23_1_ == '\0') &&
      (local_78 != (element_type *)0x0)) &&
     (expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload.
      super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
      super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._23_1_ =
           expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
           _M_payload.
           super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
           super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_payload._8_1_ ^ 1,
     expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload.
     super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
     super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_payload._8_1_ != '\0')) {
    std::
    make_shared<AssignStatementAstNode,std::shared_ptr<Token>&,std::shared_ptr<ExpressionAstNode>&>
              ((shared_ptr<Token> *)
               &identifier.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               (shared_ptr<ExpressionAstNode> *)&stack0xffffffffffffff88);
    _Var1._M_pi = local_60[0]._M_pi;
    (__return_storage_ptr__->
    super__Optional_base<std::shared_ptr<AssignStatementAstNode>,_false,_false>)._M_payload.
    super__Optional_payload<std::shared_ptr<AssignStatementAstNode>,_true,_false,_false>.
    super__Optional_payload_base<std::shared_ptr<AssignStatementAstNode>_>._M_payload._M_value.
    super___shared_ptr<AssignStatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         identifier.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    local_60[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (__return_storage_ptr__->
    super__Optional_base<std::shared_ptr<AssignStatementAstNode>,_false,_false>)._M_payload.
    super__Optional_payload<std::shared_ptr<AssignStatementAstNode>,_true,_false,_false>.
    super__Optional_payload_base<std::shared_ptr<AssignStatementAstNode>_>._M_payload._M_value.
    super___shared_ptr<AssignStatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Var1._M_pi;
    identifier.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (__return_storage_ptr__->
    super__Optional_base<std::shared_ptr<AssignStatementAstNode>,_false,_false>)._M_payload.
    super__Optional_payload<std::shared_ptr<AssignStatementAstNode>,_true,_false,_false>.
    super__Optional_payload_base<std::shared_ptr<AssignStatementAstNode>_>._M_engaged = true;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_60);
  }
  else {
    (__return_storage_ptr__->
    super__Optional_base<std::shared_ptr<AssignStatementAstNode>,_false,_false>)._M_payload.
    super__Optional_payload<std::shared_ptr<AssignStatementAstNode>,_true,_false,_false>.
    super__Optional_payload_base<std::shared_ptr<AssignStatementAstNode>_>._M_engaged = false;
  }
  std::_Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>::_M_reset
            ((_Optional_payload_base<std::shared_ptr<ExpressionAstNode>_> *)local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&identifier);
  return __return_storage_ptr__;
}

Assistant:

const std::optional<std::shared_ptr<AssignStatementAstNode>>
Parser::parseAssignStatement() noexcept {
  bool error = false;

  auto identifier = this->expect(TokenType::Identifier, error, "Expected a identifier");

  this->skipWhiteSpace();

  this->expect(TokenType::Assign, error, "Expected an equals following var declaration");

  auto expression = this->parseExpression();

  this->expect(TokenType::SemiColon, error,
    "Expected a semicolon following expression of var declaration");

  error = error || !identifier || !expression;

  if (error) { return std::nullopt; }

  return std::make_shared<AssignStatementAstNode>(identifier, expression.value());
}